

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O3

void nhdp_db_link_connect_dualstack(nhdp_link *l_ipv4,nhdp_link *l_ipv6)

{
  nhdp_link *pnVar1;
  
  pnVar1 = l_ipv4->dualstack_partner;
  if (pnVar1 != l_ipv6) {
    if (pnVar1 != (nhdp_link *)0x0) {
      pnVar1->dualstack_partner = (nhdp_link *)0x0;
    }
    l_ipv4->dualstack_partner = l_ipv6;
  }
  pnVar1 = l_ipv6->dualstack_partner;
  if (pnVar1 != l_ipv4) {
    if (pnVar1 != (nhdp_link *)0x0) {
      pnVar1->dualstack_partner = (nhdp_link *)0x0;
    }
    l_ipv6->dualstack_partner = l_ipv4;
  }
  return;
}

Assistant:

void
nhdp_db_link_connect_dualstack(struct nhdp_link *l_ipv4, struct nhdp_link *l_ipv6) {
  if (l_ipv4->dualstack_partner != l_ipv6) {
    nhdp_db_link_disconnect_dualstack(l_ipv4);
    l_ipv4->dualstack_partner = l_ipv6;
  }

  if (l_ipv6->dualstack_partner != l_ipv4) {
    nhdp_db_link_disconnect_dualstack(l_ipv6);
    l_ipv6->dualstack_partner = l_ipv4;
  }
}